

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.hpp
# Opt level: O2

back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_> __thiscall
pstore::diff_details::
traverser<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
::
visit_node<std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
          (traverser<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
           *this,index_pointer node,uint shifts,
          back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_> out)

{
  bool bVar1;
  back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_> bVar2;
  index_pointer node_local;
  address local_10;
  
  node_local = node;
  if (((ulong)node.internal_ & 1) != 0) {
    if (shifts < 0x42) {
      bVar2 = visit_intermediate<pstore::index::details::internal_node,std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
                        (this,node,shifts,out);
      return (back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>)
             bVar2.container;
    }
    bVar2 = visit_intermediate<pstore::index::details::linear_node,std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
                      (this,node,shifts,out);
    return (back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>)
           bVar2.container;
  }
  if (((ulong)node.internal_ & 2) == 0) {
    bVar1 = traverser<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::is_new((traverser<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)this,node);
    if (bVar1) {
      local_10 = pstore::index::details::index_pointer::to_address
                           ((index_pointer *)&node_local.addr_);
      std::vector<pstore::address,_std::allocator<pstore::address>_>::emplace_back<pstore::address>
                (out.container,&local_10);
    }
    return (back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>)
           (back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>)
           out.container;
  }
  assert_failed("node.is_address ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/diff.hpp"
                ,0x62);
}

Assistant:

OutputIterator traverser<Index>::visit_node (index_pointer node, unsigned shifts,
                                                     OutputIterator out) const {
            if (node.is_leaf ()) {
                PSTORE_ASSERT (node.is_address ());
                // If this leaf is not in the "old" byte range then add it to the output
                // collection.
                if (this->is_new (node)) {
                    *out = node.to_address ();
                    ++out;
                }
                return out;
            }

            if (index::details::depth_is_internal_node (shifts)) {
                return this->visit_intermediate<index::details::internal_node> (node, shifts,
                                                                                out);
            }

            return this->visit_intermediate<index::details::linear_node> (node, shifts, out);
        }